

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

int parse_events(cfg_file *cfg,rc_test_config *ea)

{
  int iVar1;
  int local_20;
  int i;
  int ret;
  rc_test_config *ea_local;
  cfg_file *cfg_local;
  
  local_20 = 0;
  while( true ) {
    if (0x7f < local_20) {
      return 0;
    }
    iVar1 = scan_event_line(cfg,ea->event + local_20);
    if (iVar1 < 0) break;
    local_20 = local_20 + 1;
  }
  ea->event_cnt = local_20;
  return 0;
}

Assistant:

static int parse_events(struct cfg_file *cfg, struct rc_test_config *ea)
{
    int ret;
    int i;

    for (i = 0; i < 128; ++i) {
        ret = scan_event_line(cfg, &ea->event[i]);
        if (ret < 0) {
            ea->event_cnt = i;
            break;
        }
    }

    return 0;
}